

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::mark_eliminated_clauses_as_garbage
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  bool bVar1;
  Eliminator *c_00;
  iterator iVar2;
  iterator this_00;
  Clause *c_01;
  undefined1 *in_RCX;
  long in_RSI;
  Internal *in_RDI;
  Clause **d;
  iterator __end1_1;
  iterator __begin1_1;
  Occs *__range1_1;
  Occs *ns;
  Clause **c;
  iterator __end1;
  iterator __begin1;
  Occs *__range1;
  Occs *ps;
  int64_t substitute;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Clause *in_stack_ffffffffffffff88;
  Internal *in_stack_ffffffffffffff90;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  in_stack_ffffffffffffff98;
  Clause *in_stack_ffffffffffffffa0;
  Eliminator *in_stack_ffffffffffffffa8;
  Eliminator *eliminator_00;
  Internal *in_stack_ffffffffffffffb0;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_40;
  Occs *local_38;
  Occs *local_30;
  size_type local_28;
  undefined1 *local_20;
  
  local_20 = in_RCX;
  local_28 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::size
                       ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                        (in_RSI + 0x90));
  local_38 = occs(in_RDI,in_stack_ffffffffffffff7c);
  local_30 = local_38;
  local_40._M_current =
       (Clause **)
       std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                 ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
            ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    in_stack_ffffffffffffffb0 =
         (Internal *)
         __gnu_cxx::
         __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
         ::operator*(&local_40);
    if ((*(uint *)&(*(Clause **)in_stack_ffffffffffffffb0)->field_0x8 >> 4 & 1) == 0) {
      if ((local_28 == 0) ||
         ((*(uint *)&(*(Clause **)in_stack_ffffffffffffffb0)->field_0x8 >> 5 & 1) != 0)) {
        if (in_RDI->proof != (Proof *)0x0) {
          Proof::weaken_minus((Proof *)in_RDI,
                              (Clause *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
        if ((*(Clause **)in_stack_ffffffffffffffb0)->size == 2) {
          *local_20 = 1;
        }
        External::push_clause_on_extension_stack
                  ((External *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                   (int)((ulong)in_RDI >> 0x20));
      }
      mark_garbage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      elim_update_removed_clause
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (int)((ulong)in_stack_ffffffffffffff98._M_current >> 0x20));
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++(&local_40);
  }
  erase_occs((Occs *)0xd8ff60);
  c_00 = (Eliminator *)occs(in_RDI,in_stack_ffffffffffffff7c);
  eliminator_00 = c_00;
  iVar2 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                    ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this_00 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                      ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    c_01 = (Clause *)
           __gnu_cxx::
           __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
           ::operator*((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                        *)&stack0xffffffffffffff98);
    if ((*(uint *)&((Clause *)(c_01->field_0).id)->field_0x8 >> 4 & 1) == 0) {
      if ((local_28 == 0) || ((*(uint *)&((Clause *)(c_01->field_0).id)->field_0x8 >> 5 & 1) != 0))
      {
        if (in_RDI->proof != (Proof *)0x0) {
          Proof::weaken_minus((Proof *)in_RDI,
                              (Clause *)
                              CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
        if (((c_01->field_0).copy)->size == 2) {
          *local_20 = 1;
        }
        External::push_clause_on_extension_stack
                  ((External *)this_00._M_current,c_01,(int)((ulong)in_RDI >> 0x20));
      }
      mark_garbage((Internal *)this_00._M_current,c_01);
      elim_update_removed_clause
                (in_stack_ffffffffffffffb0,eliminator_00,(Clause *)c_00,
                 (int)((ulong)iVar2._M_current >> 0x20));
    }
    __gnu_cxx::
    __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
    ::operator++((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                  *)&stack0xffffffffffffff98);
  }
  erase_occs((Occs *)0xd900a8);
  return;
}

Assistant:

void Internal::mark_eliminated_clauses_as_garbage (
    Eliminator &eliminator, int pivot, bool &deleted_binary_clause) {
  assert (!unsat);

  LOG ("marking irredundant clauses with %d as garbage", pivot);

  const int64_t substitute = eliminator.gates.size ();
  if (substitute)
    LOG ("pushing %" PRId64 " gate clauses on extension stack", substitute);
#ifndef NDEBUG
  int64_t pushed = 0;
#endif
  Occs &ps = occs (pivot);
  for (const auto &c : ps) {
    if (c->garbage)
      continue;
    assert (!c->redundant);
    if (!substitute || c->gate) {
      if (proof)
        proof->weaken_minus (c);
      if (c->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (c, pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (c);
    elim_update_removed_clause (eliminator, c, pivot);
  }
  erase_occs (ps);

  LOG ("marking irredundant clauses with %d as garbage", -pivot);

  Occs &ns = occs (-pivot);
  for (const auto &d : ns) {
    if (d->garbage)
      continue;
    assert (!d->redundant);
    if (!substitute || d->gate) {
      if (proof)
        proof->weaken_minus (d);
      if (d->size == 2)
        deleted_binary_clause = true;
      external->push_clause_on_extension_stack (d, -pivot);
#ifndef NDEBUG
      pushed++;
#endif
    }
    mark_garbage (d);
    elim_update_removed_clause (eliminator, d, -pivot);
  }
  erase_occs (ns);

  if (substitute)
    assert (pushed <= substitute);

  // Unfortunately, we can not use the trick by Niklas Soerensson anymore,
  // which avoids saving all clauses on the extension stack.  This would
  // break our new incremental 'restore' logic.
}